

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O0

option_group_definition * __thiscall
VW::config::option_group_definition::
add<VW::config::typed_option<std::vector<char,std::allocator<char>>>>
          (option_group_definition *this,typed_option<std::vector<char,_std::allocator<char>_>_> *op
          )

{
  option_group_definition *in_RDI;
  value_type *in_stack_ffffffffffffff98;
  typed_option<std::vector<char,_std::allocator<char>_>_> *in_stack_ffffffffffffffc8;
  
  std::
  make_shared<VW::config::typed_option<std::vector<char,std::allocator<char>>>,VW::config::typed_option<std::vector<char,std::allocator<char>>>&>
            (in_stack_ffffffffffffffc8);
  std::shared_ptr<VW::config::base_option>::
  shared_ptr<VW::config::typed_option<std::vector<char,std::allocator<char>>>,void>
            ((shared_ptr<VW::config::base_option> *)in_RDI,
             (shared_ptr<VW::config::typed_option<std::vector<char,_std::allocator<char>_>_>_> *)
             in_stack_ffffffffffffff98);
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::push_back((vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
               *)in_RDI,in_stack_ffffffffffffff98);
  std::shared_ptr<VW::config::base_option>::~shared_ptr
            ((shared_ptr<VW::config::base_option> *)0x1a1da4);
  std::shared_ptr<VW::config::typed_option<std::vector<char,_std::allocator<char>_>_>_>::~shared_ptr
            ((shared_ptr<VW::config::typed_option<std::vector<char,_std::allocator<char>_>_>_> *)
             0x1a1dae);
  return in_RDI;
}

Assistant:

option_group_definition& add(T&& op)
  {
    m_options.push_back(std::make_shared<typename std::decay<T>::type>(op));
    return *this;
  }